

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::LatchVisitor::IfVisitor::visit(IfVisitor *this,IfStmt *stmt)

{
  bool bVar1;
  element_type *var;
  undefined1 local_28 [24];
  IfStmt *stmt_local;
  IfVisitor *this_local;
  
  local_28._16_8_ = stmt;
  stmt_local = (IfStmt *)this;
  IfStmt::predicate((IfStmt *)local_28);
  var = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  bVar1 = has_var(var,this->var_);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_28);
  if (bVar1) {
    std::
    unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
    ::emplace<kratos::IfStmt*&>
              ((unordered_set<kratos::IfStmt*,std::hash<kratos::IfStmt*>,std::equal_to<kratos::IfStmt*>,std::allocator<kratos::IfStmt*>>
                *)&this->ifs_,(IfStmt **)(local_28 + 0x10));
  }
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
            if (has_var(stmt->predicate().get(), var_)) ifs_.emplace(stmt);
        }